

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

int Wlc_NtkCreateLevelsRev(Wlc_Ntk_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  int Entry;
  int i;
  int iVar2;
  Wlc_Obj_t *pWVar3;
  int in_EDX;
  int iVar4;
  int i_00;
  int iVar5;
  
  p_00 = &p->vLevels;
  Vec_IntFill(p_00,p->iObj,in_EDX);
  iVar5 = p->iObj;
  iVar4 = 0;
  while (1 < iVar5) {
    iVar5 = iVar5 + -1;
    pWVar3 = Wlc_NtkObj(p,iVar5);
    if ((undefined1  [24])((undefined1  [24])*pWVar3 & (undefined1  [24])0x3d) !=
        (undefined1  [24])0x1) {
      iVar1 = Wlc_ObjLevel(p,pWVar3);
      Entry = iVar1 + 1;
      for (i_00 = 0; i_00 < (int)pWVar3->nFanins; i_00 = i_00 + 1) {
        i = Wlc_ObjFaninId(pWVar3,i_00);
        iVar2 = Vec_IntEntry(p_00,i);
        if (iVar2 <= iVar1) {
          Vec_IntWriteEntry(p_00,i,Entry);
        }
      }
      if (iVar4 <= Entry) {
        iVar4 = Entry;
      }
    }
  }
  for (iVar5 = 1; iVar5 < p->iObj; iVar5 = iVar5 + 1) {
    Wlc_NtkObj(p,iVar5);
    iVar1 = Vec_IntEntry(p_00,iVar5);
    Vec_IntWriteEntry(p_00,iVar5,iVar4 - iVar1);
  }
  for (iVar5 = 0; iVar5 < (p->vCis).nSize; iVar5 = iVar5 + 1) {
    pWVar3 = Wlc_NtkCi(p,iVar5);
    Vec_IntWriteEntry(p_00,(int)(((long)pWVar3 - (long)p->pObjs) / 0x18),0);
  }
  return iVar4;
}

Assistant:

int Wlc_NtkCreateLevelsRev( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; 
    int i, k, iFanin, Level, LevelMax = 0;
    Vec_IntFill( &p->vLevels, Wlc_NtkObjNumMax(p), 0 );
    Wlc_NtkForEachObjReverse( p, pObj, i )
    {
        if ( Wlc_ObjIsCi(pObj) )
            continue;
        Level = Wlc_ObjLevel(p, pObj) + 1;
        Wlc_ObjForEachFanin( pObj, iFanin, k )
            Vec_IntUpdateEntry( &p->vLevels, iFanin, Level );
        LevelMax = Abc_MaxInt( LevelMax, Level );
    }
    // reverse the values
    Wlc_NtkForEachObj( p, pObj, i )
        Vec_IntWriteEntry( &p->vLevels, i, LevelMax - Wlc_ObjLevelId(p, i) );
    Wlc_NtkForEachCi( p, pObj, i )
        Vec_IntWriteEntry( &p->vLevels, Wlc_ObjId(p, pObj), 0 );
    //Wlc_NtkForEachObj( p, pObj, i )
    //    printf( "%d -> %d\n", i, Wlc_ObjLevelId(p, i) );
    return LevelMax;
}